

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

string * to_string_abi_cxx11_(ze_device_memory_access_properties_t val)

{
  ostream *poVar1;
  string *in_RDI;
  ze_structure_type_t in_stack_00000008;
  ze_memory_access_cap_flag_t in_stack_00000018;
  ze_memory_access_cap_flag_t in_stack_0000001c;
  stringstream ss;
  ze_memory_access_cap_flag_t in_stack_00000024;
  ze_memory_access_cap_flag_t in_stack_00000028;
  string asStack_1b8 [32];
  undefined1 local_198 [392];
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_198,in_stack_00000008);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  poVar1 = std::operator<<((ostream *)(local_198 + 0x10),"0x");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_198,in_stack_00000018);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_198,in_stack_0000001c);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_198,_ss);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_198,in_stack_00000024);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::append((char *)in_RDI);
  std::__cxx11::string::append((char *)in_RDI);
  to_string_abi_cxx11_((string *)local_198,in_stack_00000028);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

std::string to_string( ze_device_memory_access_properties_t val )
{
    std::string str;
    
    str += "ze_device_memory_access_properties_t.stype : ";
    str += to_string(val.stype);
    str += "\n";
    
    str += "ze_device_memory_access_properties_t.pNext : ";
    {
        std::stringstream ss;
        ss << "0x" << std::hex << reinterpret_cast<size_t>(val.pNext);
        str += ss.str();
    }
    str += "\n";
    
    str += "ze_device_memory_access_properties_t.hostAllocCapabilities : ";
    str += to_string((ze_memory_access_cap_flag_t)val.hostAllocCapabilities);
    str += "\n";
    
    str += "ze_device_memory_access_properties_t.deviceAllocCapabilities : ";
    str += to_string((ze_memory_access_cap_flag_t)val.deviceAllocCapabilities);
    str += "\n";
    
    str += "ze_device_memory_access_properties_t.sharedSingleDeviceAllocCapabilities : ";
    str += to_string((ze_memory_access_cap_flag_t)val.sharedSingleDeviceAllocCapabilities);
    str += "\n";
    
    str += "ze_device_memory_access_properties_t.sharedCrossDeviceAllocCapabilities : ";
    str += to_string((ze_memory_access_cap_flag_t)val.sharedCrossDeviceAllocCapabilities);
    str += "\n";
    
    str += "ze_device_memory_access_properties_t.sharedSystemAllocCapabilities : ";
    str += to_string((ze_memory_access_cap_flag_t)val.sharedSystemAllocCapabilities);
    str += "\n";

    return str;
}